

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ImRect unclipped_rect;
  ImRect local_48;
  float local_2c;
  
  pIVar4 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (pIVar2->ClipRect).Min;
    local_48.Max = (pIVar2->ClipRect).Max;
    if (GImGui->NavMoveRequest == true) {
      local_2c = items_height;
      ImRect::Add(&local_48,&GImGui->NavScoringRect);
      items_height = local_2c;
    }
    if ((pIVar4->NavJustMovedToId != 0) && (pIVar2->NavLastIds[0] == pIVar4->NavJustMovedToId)) {
      fVar1 = (pIVar2->Pos).y;
      fVar3 = fVar1 + pIVar2->NavRectRel[0].Min.y;
      fVar1 = fVar1 + pIVar2->NavRectRel[0].Max.y;
      if (fVar3 < local_48.Min.y) {
        local_48.Min.y = fVar3;
      }
      if (local_48.Max.y < fVar1) {
        local_48.Max.y = fVar1;
      }
    }
    fVar1 = (pIVar2->DC).CursorPos.y;
    iVar6 = (int)((local_48.Min.y - fVar1) / items_height);
    iVar5 = (int)((local_48.Max.y - fVar1) / items_height);
    if (pIVar4->NavMoveRequest == true) {
      iVar6 = iVar6 - (uint)(pIVar4->NavMoveClipDir == 2);
      iVar5 = iVar5 + (uint)(pIVar4->NavMoveClipDir == 3);
    }
    iVar7 = items_count;
    if (iVar6 < items_count) {
      iVar7 = iVar6;
    }
    iVar8 = 0;
    if (-1 < iVar6) {
      iVar8 = iVar7;
    }
    iVar5 = iVar5 + 1;
    *out_items_display_start = iVar8;
    if (iVar5 < items_count) {
      items_count = iVar5;
    }
    if (iVar5 < iVar8) {
      items_count = iVar8;
    }
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}